

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

type jsoncons::jsonpointer::
     remove<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,char[6]>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               char (*location_str) [6],error_code *ec)

{
  basic_json_pointer<char> jsonptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  string_view_type local_28;
  
  local_28._M_len = strlen(*location_str);
  local_28._M_str = *location_str;
  basic_json_pointer<char>::parse((basic_json_pointer<char> *)&local_40,&local_28,ec);
  if (ec->_M_value == 0) {
    remove<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              (root,(basic_json_pointer<char> *)&local_40,ec);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,void>::type
    remove(Json& root, const StringSource& location_str, std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        remove(root, jsonptr, ec);
    }